

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::BufferStorageTest::iterate(BufferStorageTest *this)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *pNVar7;
  uint uVar8;
  char *description;
  uint uVar9;
  qpTestResult testResult;
  ulong uVar10;
  pointer ppBVar11;
  allocator<char> local_1bd;
  uint local_1bc;
  ulong local_1b8;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  if (!bVar3) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"GL_ARB_sparse_buffer is not supported",&local_1bd);
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (!bVar3) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set",
               &local_1bd);
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTestCases(this);
  pGVar1 = &this->m_sparse_bo;
  local_1bc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar10 = 0;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  do {
    uVar9 = (uint)uVar10;
    if (uVar9 == 0x10) {
      testResult = (byte)~(byte)local_1bc & QP_TEST_RESULT_FAIL;
      description = "Fail";
      if ((local_1bc & 1) != 0) {
        description = "Pass";
      }
LAB_00ad0d5e:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,
                 description);
      return STOP;
    }
    if ((7 >= uVar9) &&
       (uVar8 = (uint)(ushort)(((ushort)uVar10 & 7) << 8) << 4,
       uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4,
       uVar8 = (uVar8 >> 1 & 0x5540) + (uVar8 & 0x5540) * 2 >> 6, (uVar8 & 0xff) == 0)) {
      uVar9 = (uint)(7 < uVar9) << 6 | uVar8 | 0x400;
      local_1b8 = uVar10;
      (**(code **)(lVar6 + 0x6c8))(1,pGVar1);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a5e);
      (**(code **)(lVar6 + 0x40))(0x8892,this->m_sparse_bo);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a61);
      (**(code **)(lVar6 + 0x160))(0x8892,0x3e8c0000,0,uVar9);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBufferStorage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a67);
      for (ppBVar11 = (this->m_testCases).
                      super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppBVar11 !=
          (this->m_testCases).
          super__Vector_base<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppBVar11 = ppBVar11 + 1) {
        (**(code **)(lVar6 + 0x40))(0x8892,*pGVar1);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x1a6c);
        iVar4 = (*(*ppBVar11)->_vptr_BufferStorageTestCase[6])(*ppBVar11,(ulong)*pGVar1);
        if ((char)iVar4 == '\0') {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Test case [");
          iVar4 = (*(*ppBVar11)->_vptr_BufferStorageTestCase[4])();
          std::operator<<((ostream *)poVar2,(char *)CONCAT44(extraout_var_01,iVar4));
          std::operator<<((ostream *)poVar2,"] has failed to initialize.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          description = "Fail";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_00ad0d5e;
        }
        iVar4 = (*(*ppBVar11)->_vptr_BufferStorageTestCase[3])(*ppBVar11,(ulong)uVar9);
        if ((char)iVar4 == '\0') {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Test case [");
          iVar4 = (*(*ppBVar11)->_vptr_BufferStorageTestCase[4])();
          std::operator<<((ostream *)poVar2,(char *)CONCAT44(extraout_var_00,iVar4));
          std::operator<<((ostream *)poVar2,"] has failed to execute correctly.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          local_1bc = 0;
        }
        (*(*ppBVar11)->_vptr_BufferStorageTestCase[7])();
      }
      (**(code **)(lVar6 + 0x438))(1,pGVar1);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glDeleteBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x1a88);
      *pGVar1 = 0;
      uVar10 = local_1b8;
    }
    uVar10 = (ulong)((int)uVar10 + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult BufferStorageTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Only execute if the implementation supports the GL_ARB_sparse_buffer extension */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer is not supported");
	}

	/* The buffer storage test cases require OpenGL 4.3 feature-set. */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer conformance tests require OpenGL 4.3 core feature-set");
	}

	/* Register & initialize the test case objects */
	initTestCases();

	/* Iterate over all sparse BO flag combinations. We need to consider a total of 4 flags:
	 *
	 * - GL_CLIENT_STORAGE_BIT  (bit 0)
	 * - GL_DYNAMIC_STORAGE_BIT (bit 1)
	 * - GL_MAP_COHERENT_BIT    (bit 2)
	 * - GL_MAP_PERSISTENT_BIT  (bit 3)
	 *
	 *  GL_MAP_READ_BIT and GL_MAP_WRITE_BIT are excluded, since they are incompatible
	 *  with sparse buffers by definition.
	 *
	 *  GL_SPARSE_STORAGE_BIT_ARB is assumed to be always defined. Some of the combinations are invalid.
	 *  Such loop iterations will be skipped.
	 * */

	for (unsigned int n_flag_combination = 0; n_flag_combination < (1 << 4); ++n_flag_combination)
	{
		const glw::GLint flags = ((n_flag_combination & (1 << 0)) ? GL_CLIENT_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 1)) ? GL_DYNAMIC_STORAGE_BIT : 0) |
								 ((n_flag_combination & (1 << 2)) ? GL_MAP_COHERENT_BIT : 0) |
								 ((n_flag_combination & (1 << 3)) ? GL_MAP_PERSISTENT_BIT : 0) |
								 GL_SPARSE_STORAGE_BIT_ARB;

		if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
		{
			if ((flags & GL_MAP_READ_BIT) == 0 && (flags & GL_MAP_WRITE_BIT) == 0)
			{
				continue;
			}
		}

		if (((flags & GL_MAP_COHERENT_BIT) != 0) && ((flags & GL_MAP_PERSISTENT_BIT) == 0))
		{
			continue;
		}

		/* Set up the sparse BO */
		gl.genBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

		gl.bufferStorage(GL_ARRAY_BUFFER, 1024768 * 1024, /* as per test spec */
						 DE_NULL,						  /* data */
						 flags);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

		for (TestCasesVectorIterator itTestCase = m_testCases.begin(); itTestCase != m_testCases.end(); ++itTestCase)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

			if (!(*itTestCase)->initTestCaseIteration(m_sparse_bo))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to initialize."
								   << tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}

			if (!(*itTestCase)->execute(flags))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Test case [" << (*itTestCase)->getName()
								   << "] "
									  "has failed to execute correctly."
								   << tcu::TestLog::EndMessage;

				result = false;
			} /* if (!testCaseResult) */

			(*itTestCase)->deinitTestCaseIteration();
		} /* for (all added test cases) */

		/* Release the sparse BO */
		gl.deleteBuffers(1, &m_sparse_bo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers() call failed.");

		m_sparse_bo = 0;
	}

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}